

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O3

NumberParserImpl *
icu_63::numparse::impl::NumberParserImpl::createSimpleParser
          (Locale *locale,UnicodeString *patternString,parse_flags_t parseFlags,UErrorCode *status)

{
  AffixTokenMatcherWarehouse *this;
  AffixMatcherWarehouse *this_00;
  anon_struct_3968_13_3a90479f_for_fLocalMatchers *paVar1;
  UObject UVar2;
  NumberParserImpl *this_01;
  long lVar3;
  DecimalMatcher *p;
  ScientificMatcher *p_00;
  MaybeStackArray<char16_t,_4> *this_02;
  UnicodeString *this_03;
  UnicodeString *src;
  CurrencySymbols currencySymbols;
  AffixTokenMatcherSetupData affixSetupData;
  ParsedPatternInfo patternInfo;
  DecimalFormatSymbols symbols;
  DecimalFormatSymbols dfs;
  ConstChar16Ptr local_1e58;
  anon_struct_3968_13_3a90479f_for_fLocalMatchers *local_1e50;
  UObject local_1e48;
  char16_t *local_1e40;
  Grouper local_1e30;
  CurrencyUnit local_1e20;
  UnicodeString local_1e00;
  undefined1 local_1dc0 [8];
  undefined1 local_1db8 [64];
  undefined **local_1d78;
  bool local_1d70 [8];
  UnicodeString local_1d68;
  undefined1 auStack_1d28 [32];
  LocalPointer<const_icu_63::UnicodeSet> local_1d08;
  LocalArray<const_icu_63::UnicodeString> local_1d00 [7];
  LocalPointer<const_icu_63::UnicodeSet> local_1cc8;
  NumberParseMatcher local_1cc0;
  LocalArray<const_icu_63::UnicodeString> local_1cb8;
  UnicodeString local_1cb0;
  UnicodeString local_1c70 [3];
  UnicodeString local_1ba8;
  UnicodeString local_1b68;
  CharString local_1b28;
  MaybeStackArray<char16_t,_4> local_1ad8 [19];
  CurrencySymbols local_1908;
  AffixTokenMatcherSetupData local_1820;
  ParsedPatternInfo local_17f8;
  DecimalFormatSymbols local_1630;
  undefined1 local_b30 [72];
  UnicodeSet *local_ae8;
  UnicodeString local_928;
  UnicodeString local_8e8 [34];
  UBool local_38;
  UBool local_37;
  
  this_01 = (NumberParserImpl *)UMemory::operator_new((UMemory *)0x1040,(size_t)patternString);
  if (this_01 != (NumberParserImpl *)0x0) {
    NumberParserImpl(this_01,parseFlags);
  }
  DecimalFormatSymbols::DecimalFormatSymbols(&local_1630,locale,status);
  IgnorablesMatcher::IgnorablesMatcher((IgnorablesMatcher *)local_b30,DEFAULT_IGNORABLES);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).ignorables.super_SymbolMatcher.fString,
             (UnicodeString *)(local_b30 + 8));
  (this_01->fLocalMatchers).ignorables.super_SymbolMatcher.fUniSet = local_ae8;
  local_1e48._vptr_UObject = (_func_int **)&PTR__SymbolMatcher_003f1f18;
  local_b30._0_8_ = &PTR__SymbolMatcher_003f1f18;
  UnicodeString::~UnicodeString((UnicodeString *)(local_b30 + 8));
  DecimalFormatSymbols::DecimalFormatSymbols((DecimalFormatSymbols *)local_b30,locale,status);
  UnicodeString::UnicodeString((UnicodeString *)local_1dc0,L"IU$");
  local_38 = '\x01';
  UnicodeString::operator=(&local_928,(UnicodeString *)local_1dc0);
  UnicodeString::~UnicodeString((UnicodeString *)local_1dc0);
  UnicodeString::UnicodeString((UnicodeString *)local_1dc0,L"ICU");
  local_37 = '\x01';
  UnicodeString::operator=(local_8e8,(UnicodeString *)local_1dc0);
  UnicodeString::~UnicodeString((UnicodeString *)local_1dc0);
  local_1e58.p_ = L"ICU";
  CurrencyUnit::CurrencyUnit(&local_1e20,&local_1e58,status);
  icu_63::number::impl::CurrencySymbols::CurrencySymbols
            (&local_1908,&local_1e20,locale,(DecimalFormatSymbols *)local_b30,status);
  CurrencyUnit::~CurrencyUnit(&local_1e20);
  local_1e40 = local_1e58.p_;
  icu_63::number::impl::ParsedPatternInfo::ParsedPatternInfo(&local_17f8);
  icu_63::number::impl::PatternParser::parseToPatternInfo(patternString,&local_17f8,status);
  local_1820.currencySymbols = &local_1908;
  local_1820.dfs = &local_1630;
  local_1820.ignorables = &(this_01->fLocalMatchers).ignorables;
  local_1820.locale = locale;
  local_1820.parseFlags = parseFlags;
  AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
            ((AffixTokenMatcherWarehouse *)local_1dc0,&local_1820);
  this = &(this_01->fLocalMatchers).affixTokenMatcherWarehouse;
  local_1e50 = &this_01->fLocalMatchers;
  AffixTokenMatcherWarehouse::operator=(this,(AffixTokenMatcherWarehouse *)local_1dc0);
  AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse((AffixTokenMatcherWarehouse *)local_1dc0);
  AffixMatcherWarehouse::AffixMatcherWarehouse((AffixMatcherWarehouse *)local_1dc0,this);
  this_00 = &(this_01->fLocalMatchers).affixMatcherWarehouse;
  AffixMatcherWarehouse::operator=(this_00,(AffixMatcherWarehouse *)local_1dc0);
  lVar3 = -0x1e0;
  this_02 = local_1ad8;
  do {
    *(undefined ***)(this_02[-3].stackArray + 1) = &PTR__AffixPatternMatcher_003f1e20;
    MaybeStackArray<char16_t,_4>::~MaybeStackArray(this_02);
    *(undefined ***)(this_02[-3].stackArray + 1) = &PTR__ArraySeriesMatcher_003f2f48;
    MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
              ((MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *)
               (this_02 + -2));
    paVar1 = local_1e50;
    this_02 = (MaybeStackArray<char16_t,_4> *)(this_02[-4].stackArray + 1);
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0);
  AffixMatcherWarehouse::createAffixMatchers
            (this_00,&local_17f8.super_AffixPatternProvider,(MutableMatcherCollection *)this_01,
             &local_1e50->ignorables,parseFlags,status);
  local_1e30 = icu_63::number::impl::Grouper::forStrategy(UNUM_GROUPING_AUTO);
  icu_63::number::impl::Grouper::setLocaleData(&local_1e30,&local_17f8,locale);
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_01,paVar1);
  DecimalMatcher::DecimalMatcher((DecimalMatcher *)local_1dc0,&local_1630,&local_1e30,parseFlags);
  p = &(this_01->fLocalMatchers).decimal;
  (this_01->fLocalMatchers).decimal.requireGroupingMatch = (bool)local_1db8[0];
  (this_01->fLocalMatchers).decimal.groupingDisabled = (bool)local_1db8[1];
  (this_01->fLocalMatchers).decimal.integerOnly = (bool)local_1db8[2];
  (this_01->fLocalMatchers).decimal.field_0xb = local_1db8[3];
  (this_01->fLocalMatchers).decimal.grouping1 = local_1db8._4_2_;
  (this_01->fLocalMatchers).decimal.grouping2 = local_1db8._6_2_;
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).decimal.groupingSeparator,(UnicodeString *)(local_1db8 + 8))
  ;
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).decimal.decimalSeparator,(UnicodeString *)local_1d70);
  (this_01->fLocalMatchers).decimal.groupingUniSet =
       (UnicodeSet *)
       CONCAT71(local_1d68.fUnion._49_7_,local_1d68.fUnion.fStackFields.fBuffer[0x17]._0_1_);
  (this_01->fLocalMatchers).decimal.decimalUniSet = (UnicodeSet *)auStack_1d28._0_8_;
  (this_01->fLocalMatchers).decimal.separatorSet = (UnicodeSet *)auStack_1d28._8_8_;
  (this_01->fLocalMatchers).decimal.leadSet = (UnicodeSet *)auStack_1d28._16_8_;
  LocalPointer<const_icu_63::UnicodeSet>::moveFrom
            (&(this_01->fLocalMatchers).decimal.fLocalDecimalUniSet,
             (LocalPointer<const_icu_63::UnicodeSet> *)(auStack_1d28 + 0x18));
  LocalPointer<const_icu_63::UnicodeSet>::moveFrom
            (&(this_01->fLocalMatchers).decimal.fLocalSeparatorSet,&local_1d08);
  LocalArray<const_icu_63::UnicodeString>::moveFrom
            (&(this_01->fLocalMatchers).decimal.fLocalDigitStrings,local_1d00);
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_01);
  local_1dc0 = (undefined1  [8])&PTR__DecimalMatcher_003f30d0;
  LocalArray<const_icu_63::UnicodeString>::~LocalArray(local_1d00);
  if (local_1d08.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet
              ((UnicodeSet *)local_1d08.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr);
  }
  UMemory::operator_delete
            ((UMemory *)local_1d08.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr,p);
  if ((UnicodeSet *)auStack_1d28._24_8_ != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet((UnicodeSet *)auStack_1d28._24_8_);
  }
  UMemory::operator_delete((UMemory *)auStack_1d28._24_8_,p);
  UnicodeString::~UnicodeString((UnicodeString *)local_1d70);
  UnicodeString::~UnicodeString((UnicodeString *)(local_1db8 + 8));
  MinusSignMatcher::MinusSignMatcher((MinusSignMatcher *)local_1dc0,&local_1630,false);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).minusSign.super_SymbolMatcher.fString,
             (UnicodeString *)local_1db8);
  UVar2._vptr_UObject = local_1e48._vptr_UObject;
  (this_01->fLocalMatchers).minusSign.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (this_01->fLocalMatchers).minusSign.fAllowTrailing = local_1d70[0];
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).minusSign);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  PlusSignMatcher::PlusSignMatcher((PlusSignMatcher *)local_1dc0,&local_1630,false);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).plusSign.super_SymbolMatcher.fString,
             (UnicodeString *)local_1db8);
  (this_01->fLocalMatchers).plusSign.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (this_01->fLocalMatchers).plusSign.fAllowTrailing = local_1d70[0];
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).plusSign);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  PercentMatcher::PercentMatcher((PercentMatcher *)local_1dc0,&local_1630);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).percent.super_SymbolMatcher.fString,
             (UnicodeString *)local_1db8);
  (this_01->fLocalMatchers).percent.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).percent);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  PermilleMatcher::PermilleMatcher((PermilleMatcher *)local_1dc0,&local_1630);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).permille.super_SymbolMatcher.fString,
             (UnicodeString *)local_1db8);
  (this_01->fLocalMatchers).permille.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).permille);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  NanMatcher::NanMatcher((NanMatcher *)local_1dc0,&local_1630);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).nan.super_SymbolMatcher.fString,(UnicodeString *)local_1db8)
  ;
  (this_01->fLocalMatchers).nan.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).nan);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  InfinityMatcher::InfinityMatcher((InfinityMatcher *)local_1dc0,&local_1630);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).infinity.super_SymbolMatcher.fString,
             (UnicodeString *)local_1db8);
  (this_01->fLocalMatchers).infinity.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).infinity);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  UnicodeString::UnicodeString(&local_1e00,L"@");
  PaddingMatcher::PaddingMatcher((PaddingMatcher *)local_1dc0,&local_1e00);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).padding.super_SymbolMatcher.fString,
             (UnicodeString *)local_1db8);
  (this_01->fLocalMatchers).padding.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_1d78;
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).padding);
  local_1dc0 = (undefined1  [8])UVar2._vptr_UObject;
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  UnicodeString::~UnicodeString(&local_1e00);
  ScientificMatcher::ScientificMatcher((ScientificMatcher *)local_1dc0,&local_1630,&local_1e30);
  p_00 = &(this_01->fLocalMatchers).scientific;
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).scientific.fExponentSeparatorString,
             (UnicodeString *)local_1db8);
  (this_01->fLocalMatchers).scientific.fExponentMatcher.requireGroupingMatch = local_1d70[0];
  (this_01->fLocalMatchers).scientific.fExponentMatcher.groupingDisabled =
       (bool)(char)local_1d70._1_7_;
  (this_01->fLocalMatchers).scientific.fExponentMatcher.integerOnly =
       (bool)SUB71(local_1d70._1_7_,1);
  (this_01->fLocalMatchers).scientific.fExponentMatcher.field_0xb = SUB71(local_1d70._1_7_,2);
  (this_01->fLocalMatchers).scientific.fExponentMatcher.grouping1 = SUB72(local_1d70._1_7_,3);
  (this_01->fLocalMatchers).scientific.fExponentMatcher.grouping2 = SUB72(local_1d70._1_7_,5);
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).scientific.fExponentMatcher.groupingSeparator,&local_1d68);
  src = (UnicodeString *)auStack_1d28;
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).scientific.fExponentMatcher.decimalSeparator,src);
  (this_01->fLocalMatchers).scientific.fExponentMatcher.groupingUniSet =
       (UnicodeSet *)local_1d00[3].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
  (this_01->fLocalMatchers).scientific.fExponentMatcher.decimalUniSet =
       (UnicodeSet *)local_1d00[4].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
  (this_01->fLocalMatchers).scientific.fExponentMatcher.separatorSet =
       (UnicodeSet *)local_1d00[5].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
  (this_01->fLocalMatchers).scientific.fExponentMatcher.leadSet =
       (UnicodeSet *)local_1d00[6].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
  LocalPointer<const_icu_63::UnicodeSet>::moveFrom
            (&(this_01->fLocalMatchers).scientific.fExponentMatcher.fLocalDecimalUniSet,&local_1cc8)
  ;
  LocalPointer<const_icu_63::UnicodeSet>::moveFrom
            (&(this_01->fLocalMatchers).scientific.fExponentMatcher.fLocalSeparatorSet,
             (LocalPointer<const_icu_63::UnicodeSet> *)&local_1cc0);
  LocalArray<const_icu_63::UnicodeString>::moveFrom
            (&(this_01->fLocalMatchers).scientific.fExponentMatcher.fLocalDigitStrings,&local_1cb8);
  UnicodeString::moveFrom(&(this_01->fLocalMatchers).scientific.fCustomMinusSign,&local_1cb0);
  UnicodeString::moveFrom(&(this_01->fLocalMatchers).scientific.fCustomPlusSign,local_1c70);
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_01);
  local_1dc0 = (undefined1  [8])&PTR__ScientificMatcher_003f1e98;
  UnicodeString::~UnicodeString(local_1c70);
  UnicodeString::~UnicodeString(&local_1cb0);
  local_1d78 = &PTR__DecimalMatcher_003f30d0;
  LocalArray<const_icu_63::UnicodeString>::~LocalArray(&local_1cb8);
  if ((UnicodeSet *)local_1cc0._vptr_NumberParseMatcher != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet((UnicodeSet *)local_1cc0._vptr_NumberParseMatcher);
  }
  UMemory::operator_delete((UMemory *)local_1cc0._vptr_NumberParseMatcher,p_00);
  if (local_1cc8.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet
              ((UnicodeSet *)local_1cc8.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr);
  }
  UMemory::operator_delete
            ((UMemory *)local_1cc8.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr,p_00);
  UnicodeString::~UnicodeString(src);
  UnicodeString::~UnicodeString(&local_1d68);
  UnicodeString::~UnicodeString((UnicodeString *)local_1db8);
  CombinedCurrencyMatcher::CombinedCurrencyMatcher
            ((CombinedCurrencyMatcher *)local_1dc0,&local_1908,&local_1630,parseFlags,status);
  *(undefined8 *)(this_01->fLocalMatchers).currency.fCurrencyCode = local_1db8._0_8_;
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).currency.fCurrency1,(UnicodeString *)(local_1db8 + 8));
  UnicodeString::moveFrom
            (&(this_01->fLocalMatchers).currency.fCurrency2,(UnicodeString *)local_1d70);
  (this_01->fLocalMatchers).currency.fUseFullCurrencyData =
       (bool)local_1d68.fUnion.fStackFields.fBuffer[0x17]._0_1_;
  this_03 = (UnicodeString *)&(this_01->fLocalMatchers).currency.field_0x98;
  lVar3 = 6;
  do {
    UnicodeString::moveFrom(this_03,src);
    src = src + 1;
    this_03 = this_03 + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  UnicodeString::moveFrom(&(this_01->fLocalMatchers).currency.afterPrefixInsert,&local_1ba8);
  UnicodeString::moveFrom(&(this_01->fLocalMatchers).currency.beforeSuffixInsert,&local_1b68);
  CharString::operator=(&(this_01->fLocalMatchers).currency.fLocaleName,&local_1b28);
  (*(this_01->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (this_01,&(this_01->fLocalMatchers).currency);
  local_1dc0 = (undefined1  [8])&PTR__CombinedCurrencyMatcher_003f3050;
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_1b28.buffer);
  UnicodeString::~UnicodeString(&local_1b68);
  UnicodeString::~UnicodeString(&local_1ba8);
  lVar3 = 0x1d8;
  do {
    UnicodeString::~UnicodeString((UnicodeString *)(local_1dc0 + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != 0x58);
  UnicodeString::~UnicodeString((UnicodeString *)local_1d70);
  UnicodeString::~UnicodeString((UnicodeString *)(local_1db8 + 8));
  this_01->fFrozen = true;
  icu_63::number::impl::ParsedPatternInfo::~ParsedPatternInfo(&local_17f8);
  UnicodeString::~UnicodeString(&local_1908.fIntlCurrencySymbol);
  UnicodeString::~UnicodeString(&local_1908.fCurrencySymbol);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_1908.fLocaleName.buffer);
  CurrencyUnit::~CurrencyUnit(&local_1908.fCurrency);
  DecimalFormatSymbols::~DecimalFormatSymbols((DecimalFormatSymbols *)local_b30);
  DecimalFormatSymbols::~DecimalFormatSymbols(&local_1630);
  return this_01;
}

Assistant:

NumberParserImpl*
NumberParserImpl::createSimpleParser(const Locale& locale, const UnicodeString& patternString,
                                     parse_flags_t parseFlags, UErrorCode& status) {

    LocalPointer<NumberParserImpl> parser(new NumberParserImpl(parseFlags));
    DecimalFormatSymbols symbols(locale, status);

    parser->fLocalMatchers.ignorables = {unisets::DEFAULT_IGNORABLES};
    IgnorablesMatcher& ignorables = parser->fLocalMatchers.ignorables;

    DecimalFormatSymbols dfs(locale, status);
    dfs.setSymbol(DecimalFormatSymbols::kCurrencySymbol, u"IU$");
    dfs.setSymbol(DecimalFormatSymbols::kIntlCurrencySymbol, u"ICU");
    CurrencySymbols currencySymbols({u"ICU", status}, locale, dfs, status);

    ParsedPatternInfo patternInfo;
    PatternParser::parseToPatternInfo(patternString, patternInfo, status);

    // The following statements set up the affix matchers.
    AffixTokenMatcherSetupData affixSetupData = {
            currencySymbols, symbols, ignorables, locale, parseFlags};
    parser->fLocalMatchers.affixTokenMatcherWarehouse = {&affixSetupData};
    parser->fLocalMatchers.affixMatcherWarehouse = {&parser->fLocalMatchers.affixTokenMatcherWarehouse};
    parser->fLocalMatchers.affixMatcherWarehouse.createAffixMatchers(
            patternInfo, *parser, ignorables, parseFlags, status);

    Grouper grouper = Grouper::forStrategy(UNUM_GROUPING_AUTO);
    grouper.setLocaleData(patternInfo, locale);

    parser->addMatcher(parser->fLocalMatchers.ignorables);
    parser->addMatcher(parser->fLocalMatchers.decimal = {symbols, grouper, parseFlags});
    parser->addMatcher(parser->fLocalMatchers.minusSign = {symbols, false});
    parser->addMatcher(parser->fLocalMatchers.plusSign = {symbols, false});
    parser->addMatcher(parser->fLocalMatchers.percent = {symbols});
    parser->addMatcher(parser->fLocalMatchers.permille = {symbols});
    parser->addMatcher(parser->fLocalMatchers.nan = {symbols});
    parser->addMatcher(parser->fLocalMatchers.infinity = {symbols});
    parser->addMatcher(parser->fLocalMatchers.padding = {u"@"});
    parser->addMatcher(parser->fLocalMatchers.scientific = {symbols, grouper});
    parser->addMatcher(parser->fLocalMatchers.currency = {currencySymbols, symbols, parseFlags, status});
//    parser.addMatcher(new RequireNumberMatcher());

    parser->freeze();
    return parser.orphan();
}